

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpillPointers.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::SpillPointers::create(SpillPointers *this)

{
  unique_ptr<wasm::SpillPointers,_std::default_delete<wasm::SpillPointers>_> local_20 [2];
  SpillPointers *this_local;
  
  this_local = this;
  std::make_unique<wasm::SpillPointers>();
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::SpillPointers,std::default_delete<wasm::SpillPointers>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,local_20);
  std::unique_ptr<wasm::SpillPointers,_std::default_delete<wasm::SpillPointers>_>::~unique_ptr
            (local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<SpillPointers>();
  }